

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O1

int SetAllPWMsLIRMIA3(LIRMIA3 *pLIRMIA3,int *pws)

{
  double dVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int pws_tmp [4];
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = *(undefined8 *)pws;
  uStack_10 = *(undefined8 *)(pws + 2);
  lVar3 = 0;
  do {
    dVar1 = (double)(*(int *)((long)&local_18 + lVar3) + -0x5dc);
    if (*(int *)((long)pLIRMIA3->bProportionalPWs + lVar3) == 0) {
      iVar5 = (int)(dVar1 * *(double *)((long)pLIRMIA3->CoefPWs + lVar3 * 2)) + 0x5dc;
    }
    else {
      iVar4 = (int)(dVar1 * *(double *)((long)pLIRMIA3->CoefPWs + lVar3 * 2));
      *(int *)((long)&local_18 + lVar3) = iVar4;
      if (iVar4 < 0) {
        iVar5 = *(int *)((long)pLIRMIA3->MidPWs + lVar3);
        iVar4 = (int)((ulong)((long)((*(int *)((long)pLIRMIA3->MinPWs + lVar3) - iVar5) * iVar4) *
                             -0x10624dd3) >> 0x20);
        iVar5 = ((iVar4 >> 5) - (iVar4 >> 0x1f)) + iVar5;
      }
      else {
        iVar5 = *(int *)((long)pLIRMIA3->MidPWs + lVar3);
        iVar5 = ((*(int *)((long)pLIRMIA3->MaxPWs + lVar3) - iVar5) * iVar4) / 500 + iVar5;
      }
    }
    *(int *)((long)&local_18 + lVar3) = iVar5;
    iVar4 = *(int *)((long)pLIRMIA3->MaxPWs + lVar3);
    if (iVar4 <= iVar5) {
      iVar5 = iVar4;
    }
    iVar4 = *(int *)((long)pLIRMIA3->MinPWs + lVar3);
    if (iVar5 <= iVar4) {
      iVar5 = iVar4;
    }
    *(int *)((long)&local_18 + lVar3) = iVar5;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  iVar5 = ((int)local_18 * 0xff + -0x3e418) / 1000;
  iVar4 = (local_18._4_4_ * 0xff + -0x3e418) / 1000;
  iVar2 = ((int)uStack_10 * 0xff + -0x3e418) / 1000;
  iVar7 = (uStack_10._4_4_ * 0xff + -0x3e418) / 1000;
  if (0xfe < iVar5) {
    iVar5 = 0xff;
  }
  iVar6 = 0;
  if (iVar5 < 1) {
    iVar5 = iVar6;
  }
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  if (iVar4 < 1) {
    iVar4 = iVar6;
  }
  if (0xfe < iVar2) {
    iVar2 = 0xff;
  }
  if (iVar2 < 1) {
    iVar2 = iVar6;
  }
  if (0xfe < iVar7) {
    iVar7 = 0xff;
  }
  if (iVar7 < 1) {
    iVar7 = iVar6;
  }
  iVar5 = WriteDataLIRMIA3(pLIRMIA3,(uchar)iVar5,(uchar)iVar4,(uchar)iVar2,(uchar)iVar7);
  if (iVar5 == 0) {
    *(undefined8 *)pLIRMIA3->LastPWs = local_18;
    *(undefined8 *)(pLIRMIA3->LastPWs + 2) = uStack_10;
  }
  return (uint)(iVar5 != 0);
}

Assistant:

inline int SetAllPWMsLIRMIA3(LIRMIA3* pLIRMIA3, int* pws)
{
	int channel = 0;
	int pws_tmp[NB_CHANNELS_PWM_LIRMIA3];
	int M1 = 0, M2 = 0, M3 = 0, M4 = 0;

	memcpy(pws_tmp, pws, sizeof(pws_tmp));

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		if (pLIRMIA3->bProportionalPWs[channel])
		{
			pws_tmp[channel] = (int)(pLIRMIA3->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_LIRMIA3));
			if (pws_tmp[channel] >= 0)
				pws_tmp[channel] = pLIRMIA3->MidPWs[channel]+pws_tmp[channel]*(pLIRMIA3->MaxPWs[channel]-pLIRMIA3->MidPWs[channel])
				/(DEFAULT_MAX_PW_LIRMIA3-DEFAULT_MID_PW_LIRMIA3);
			else
				pws_tmp[channel] = pLIRMIA3->MidPWs[channel]+pws_tmp[channel]*(pLIRMIA3->MinPWs[channel]-pLIRMIA3->MidPWs[channel])
				/(DEFAULT_MIN_PW_LIRMIA3-DEFAULT_MID_PW_LIRMIA3);
		}
		else
		{
			pws_tmp[channel] = DEFAULT_MID_PW_LIRMIA3+(int)(pLIRMIA3->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_LIRMIA3));
		}

		pws_tmp[channel] = max(min(pws_tmp[channel], pLIRMIA3->MaxPWs[channel]), pLIRMIA3->MinPWs[channel]);
		//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_LIRMIA3), DEFAULT_ABSOLUTE_MIN_PW_LIRMIA3);

		//// The requested PWM is only applied if it is slightly different from the current value.
		//if (abs(pws_tmp[channel]-pLIRMIA3->LastPWs[channel]) < pLIRMIA3->ThresholdPWs[channel]) continue;

		//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pLIRMIA3->LastPWs[channel], abs(pws_tmp[channel]-pLIRMIA3->LastPWs[channel]), pLIRMIA3->ThresholdPWs[channel]);
	}

	//M1 = (pws_tmp[0]-pLIRMIA3->MinPWs[0])*255/(pLIRMIA3->MaxPWs[0]-pLIRMIA3->MinPWs[0]); 
	//M2 = (pws_tmp[1]-pLIRMIA3->MinPWs[1])*255/(pLIRMIA3->MaxPWs[1]-pLIRMIA3->MinPWs[1]); 
	//M3 = (pws_tmp[2]-pLIRMIA3->MinPWs[2])*255/(pLIRMIA3->MaxPWs[2]-pLIRMIA3->MinPWs[2]); 
	//M4 = (pws_tmp[3]-pLIRMIA3->MinPWs[3])*255/(pLIRMIA3->MaxPWs[3]-pLIRMIA3->MinPWs[3]);
	M1 = (pws_tmp[0]-1000)*255/1000; 
	M2 = (pws_tmp[1]-1000)*255/1000; 
	M3 = (pws_tmp[2]-1000)*255/1000; 
	M4 = (pws_tmp[3]-1000)*255/1000;

	M1 = max(min(M1, 255), 0);
	M2 = max(min(M2, 255), 0);
	M3 = max(min(M3, 255), 0);
	M4 = max(min(M4, 255), 0);

	if (WriteDataLIRMIA3(pLIRMIA3, (unsigned char)M1, (unsigned char)M2, (unsigned char)M3, (unsigned char)M4) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_LIRMIA3; channel++)
	{
		//// The requested PWM should have been only applied if it was slightly different from the current value.
		//if (abs(pws_tmp[channel]-pLIRMIA3->LastPWs[channel]) < pLIRMIA3->ThresholdPWs[channel]) continue;

		// Update last known value.
		pLIRMIA3->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}